

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

FT_Pointer ft_mem_dup(FT_Memory memory,void *address,FT_ULong size,FT_Error *p_error)

{
  FT_Pointer __dest;
  FT_Pointer p;
  FT_Error *pFStack_28;
  FT_Error error;
  FT_Error *p_error_local;
  FT_ULong size_local;
  void *address_local;
  FT_Memory memory_local;
  
  pFStack_28 = p_error;
  p_error_local = (FT_Error *)size;
  size_local = (FT_ULong)address;
  address_local = memory;
  __dest = ft_mem_qalloc(memory,size,(FT_Error *)((long)&p + 4));
  if ((p._4_4_ == 0) && (size_local != 0)) {
    memcpy(__dest,(void *)size_local,(size_t)p_error_local);
  }
  *pFStack_28 = p._4_4_;
  return __dest;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_dup( FT_Memory    memory,
              const void*  address,
              FT_ULong     size,
              FT_Error    *p_error )
  {
    FT_Error    error;
    FT_Pointer  p = ft_mem_qalloc( memory, (FT_Long)size, &error );


    if ( !error && address )
      ft_memcpy( p, address, size );

    *p_error = error;
    return p;
  }